

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode.c
# Opt level: O1

int arkAllocVec(ARKodeMem ark_mem,N_Vector tmpl,N_Vector *v)

{
  N_Vector p_Var1;
  int iVar2;
  
  iVar2 = 1;
  if (*v == (N_Vector)0x0) {
    p_Var1 = (N_Vector)N_VClone(tmpl);
    *v = p_Var1;
    if (p_Var1 == (N_Vector)0x0) {
      arkFreeVectors(ark_mem);
      iVar2 = 0;
    }
    else {
      ark_mem->lrw = ark_mem->lrw + ark_mem->lrw1;
      ark_mem->liw = ark_mem->liw + ark_mem->liw1;
    }
  }
  return iVar2;
}

Assistant:

sunbooleantype arkAllocVec(ARKodeMem ark_mem, N_Vector tmpl, N_Vector* v)
{
  /* allocate the new vector if necessary */
  if (*v == NULL)
  {
    *v = N_VClone(tmpl);
    if (*v == NULL)
    {
      arkFreeVectors(ark_mem);
      return (SUNFALSE);
    }
    else
    {
      ark_mem->lrw += ark_mem->lrw1;
      ark_mem->liw += ark_mem->liw1;
    }
  }
  return (SUNTRUE);
}